

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_policy_format_custom.c
# Opt level: O1

log_policy_interface log_policy_format_custom_interface(void)

{
  return &log_policy_format_custom_interface::policy_interface_format;
}

Assistant:

log_policy_interface log_policy_format_custom_interface(void)
{
	static struct log_policy_format_impl_type log_policy_format_custom_impl_obj = {
		&log_policy_format_custom_size,
		&log_policy_format_custom_serialize,
		&log_policy_format_custom_deserialize
	};

	static struct log_policy_interface_type policy_interface_format = {
		&log_policy_format_custom_create,
		&log_policy_format_custom_impl_obj,
		&log_policy_format_custom_destroy
	};

	return &policy_interface_format;
}